

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covenant.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool bVar2;
  Options opts_;
  int iVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  STATUS SVar7;
  options_description_easy_init *poVar8;
  typed_value<unsigned_int,_char> *ptVar9;
  typed_value<int,_char> *ptVar10;
  typed_value<covenant::AbstractMethod,_char> *ptVar11;
  typed_value<covenant::GeneralizationMethod,_char> *ptVar12;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar13;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar14;
  const_iterator cVar15;
  ostream *poVar16;
  long *plVar17;
  const_iterator cVar18;
  any *paVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  const_iterator cVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  TerminalFactory *this;
  reg_solver_t *s;
  string *psVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  char *pcVar26;
  long lVar27;
  uint num_solutions;
  uint incr_witness;
  int freq_incr_witness;
  int shortest_witness;
  AbstractMethod abs;
  GeneralizationMethod gen;
  int max_cegar_iter;
  string header;
  string in;
  CFGProblem problem;
  StrParse input;
  shared_ptr<covenant::TerminalFactory> tfac;
  options_description cmmdline_options;
  options_description log;
  positional_options_description p;
  options_description cegar_params;
  options_description hidden_params;
  options_description config;
  variables_map vm;
  ifstream fd;
  uint local_d68;
  uint local_d64;
  int local_d60;
  int local_d5c;
  AbstractMethod local_d58;
  GeneralizationMethod local_d54;
  int local_d50;
  undefined2 local_d4b;
  undefined1 local_d49;
  char *local_d48;
  long local_d40;
  char local_d38 [20];
  int local_d24;
  AbstractMethod local_d20;
  GeneralizationMethod local_d1c;
  int local_d18;
  uint local_d14;
  uint local_d10;
  int local_d0c;
  undefined1 *local_d08;
  long local_d00;
  undefined1 local_cf8 [16];
  undefined1 local_ce8 [17];
  undefined1 auStack_cd7 [15];
  size_t local_cc8;
  size_t local_cc0;
  float local_cb8;
  size_t local_cb0;
  bucket_pointer ppStack_ca8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ca0;
  undefined1 local_c88 [8];
  _Alloc_hider local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  AbstractMethod AStack_c58;
  undefined1 uStack_c54;
  undefined2 uStack_c53;
  undefined1 uStack_c51;
  int local_c50;
  int iStack_c4c;
  uint uStack_c48;
  uint uStack_c44;
  shared_ptr<covenant::TerminalFactory> local_c40;
  shared_ptr<covenant::TerminalFactory> local_c30 [11];
  key_type local_b80;
  undefined1 *local_b60;
  long local_b58;
  undefined1 local_b50 [16];
  string local_b40;
  string local_b20;
  undefined1 local_b00 [64];
  void *local_ac0;
  undefined4 local_ab8;
  undefined8 local_ab0;
  undefined4 local_aa8;
  undefined8 local_aa0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_a98 [24];
  GeneralizationMethod local_a80;
  undefined4 uStack_a7c;
  undefined1 local_a70 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_a58 [24];
  void *local_a40;
  undefined4 local_a38;
  undefined8 local_a30;
  undefined4 local_a28;
  undefined8 local_a20;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_a18 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a00;
  undefined1 *local_9e8;
  undefined1 local_9d8 [16];
  AbstractMethod local_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9b8 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_9a0 [24];
  void *local_988;
  undefined4 local_980;
  undefined8 local_978;
  undefined4 local_970;
  undefined8 local_968;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_960 [24];
  int local_948;
  undefined4 uStack_944;
  undefined1 local_938 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_920 [24];
  void *local_908;
  undefined4 local_900;
  undefined8 local_8f8;
  undefined4 local_8f0;
  undefined8 local_8e8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_8e0 [24];
  undefined1 *local_8c8 [2];
  undefined1 local_8b8 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_8a0 [24];
  void *local_888;
  undefined4 local_880;
  undefined8 local_878;
  undefined4 local_870;
  undefined8 local_868;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_860 [24];
  undefined **local_848 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_838 [8];
  _Rb_tree_node_base local_830;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_808;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7d8;
  CFGProblem local_7a8;
  undefined1 local_748 [24];
  undefined1 local_730 [56];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_6f8 [32];
  pointer local_6d8;
  
  local_d50 = -1;
  local_d54 = GREEDY;
  local_d58 = CYCLE_BREAKING;
  local_d5c = 0;
  local_d60 = -1;
  local_d64 = 1;
  local_d68 = 1;
  local_d48 = local_d38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d48,
             "Covenant: semi-decider for intersection of context-free languages\n","");
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,
             "Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n","");
  std::__cxx11::string::_M_append((char *)&local_d48,local_748._0_8_);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,"Usage   : covenant [Options] file","");
  std::__cxx11::string::_M_append((char *)&local_d48,local_748._0_8_);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"General options ","");
  boost::program_options::options_description::options_description
            ((options_description *)local_8c8,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)local_8c8);
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_748,"help,h","print help message");
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar8,"dot",
                      "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements"
                     );
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar8,"verbose,v","verbose mode");
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar8,"stats,s","Show some statistics and exit");
  ptVar9 = boost::program_options::value<unsigned_int>(&local_d68);
  local_848[0] = (undefined **)CONCAT44(local_848[0]._4_4_,1);
  ptVar9 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar9,(uint *)local_848);
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar8,"solutions",(value_semantic *)ptVar9,
                      "enumerate up to n solutions (default n=1)");
  ptVar10 = boost::program_options::value<int>(&local_d50);
  local_948 = -1;
  ptVar10 = boost::program_options::typed_value<int,_char>::default_value(ptVar10,&local_948);
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar8,"iter,i",(value_semantic *)ptVar10,
                      "maximum number of CEGAR iterations (default no limit)");
  ptVar11 = boost::program_options::value<covenant::AbstractMethod>(&local_d58);
  local_9c8 = CYCLE_BREAKING;
  ptVar11 = boost::program_options::typed_value<covenant::AbstractMethod,_char>::default_value
                      (ptVar11,&local_9c8);
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar8,"abs,a",(value_semantic *)ptVar11,
                      "choose abstraction method [sigma-star|cycle-breaking]");
  ptVar12 = boost::program_options::value<covenant::GeneralizationMethod>(&local_d54);
  local_a80 = GREEDY;
  ptVar12 = boost::program_options::typed_value<covenant::GeneralizationMethod,_char>::default_value
                      (ptVar12,&local_a80);
  boost::program_options::options_description_easy_init::operator()
            (poVar8,"gen,g",(value_semantic *)ptVar12,
             "choose generalization method [greedy|max-gen]");
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"");
  boost::program_options::options_description::options_description
            ((options_description *)&local_948,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)&local_948);
  ptVar13 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)local_748,"input-file",(value_semantic *)ptVar13,
             "input file");
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"(unsound) cegar options ","")
  ;
  boost::program_options::options_description::options_description
            ((options_description *)&local_9c8,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)&local_9c8);
  ptVar10 = boost::program_options::value<int>(&local_d5c);
  local_848[0] = (undefined **)((ulong)local_848[0] & 0xffffffff00000000);
  ptVar10 = boost::program_options::typed_value<int,_char>::default_value(ptVar10,(int *)local_848);
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)local_748,"l",(value_semantic *)ptVar10,
                      "shortest length of the witness (default 0)");
  ptVar10 = boost::program_options::value<int>(&local_d60);
  local_a80 = ~GREEDY;
  ptVar10 = boost::program_options::typed_value<int,_char>::default_value(ptVar10,(int *)&local_a80)
  ;
  poVar8 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar8,"freq-incr-witness",(value_semantic *)ptVar10,
                      "how often increasing witnesses\' length");
  ptVar9 = boost::program_options::value<unsigned_int>(&local_d64);
  local_b00._0_4_ = 1;
  ptVar9 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar9,(uint *)local_b00);
  boost::program_options::options_description_easy_init::operator()
            (poVar8,"delta-incr-witness",(value_semantic *)ptVar9,
             "how much witnesses\' length is incremented");
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"Logging Options","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_a80,(string *)local_748,0x50,0x28);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  local_748._0_8_ =
       boost::program_options::options_description::add_options((options_description *)&local_a80);
  ptVar14 = boost::program_options::
            value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x0);
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)local_748,"log",(value_semantic *)ptVar14,
             "Enable specified log level");
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_a00);
  boost::program_options::positional_options_description::add
            ((positional_options_description *)&local_a00,"input-file",-1);
  boost::program_options::options_description::options_description
            ((options_description *)local_b00,0x50,0x28);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)local_8c8);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)&local_948);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)&local_9c8);
  boost::program_options::options_description::add
            ((options_description *)local_b00,(options_description *)&local_a80);
  boost::program_options::variables_map::variables_map((variables_map *)local_848);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_748,argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((cmdline *)local_748,(options_description *)local_b00);
  local_6d8 = (pointer)local_b00;
  boost::program_options::detail::cmdline::set_positional_options
            ((cmdline *)local_748,(positional_options_description *)&local_a00);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_ce8,(basic_command_line_parser<char> *)local_748);
  boost::program_options::store((basic_parsed_options *)local_ce8,(variables_map *)local_848,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_ce8);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_6f8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_730 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_748);
  boost::program_options::notify((variables_map *)local_848);
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"help","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_838,(key_type *)local_748);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  if (cVar15._M_node != &local_830) {
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_d48,local_d40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    poVar16 = (ostream *)std::ostream::flush();
    plVar17 = (long *)boost::program_options::operator<<(poVar16,(options_description *)local_8c8);
    std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
    std::ostream::put((char)plVar17);
    std::ostream::flush();
    goto LAB_0012dc25;
  }
  local_d08 = local_cf8;
  local_d00 = 0;
  local_cf8[0] = 0;
  local_748._0_8_ = local_748 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"input-file","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_838,(key_type *)local_748);
  if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
    operator_delete((void *)local_748._0_8_);
  }
  if (cVar18._M_node == cVar15._M_node) {
LAB_0012d39f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Input file not found ",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  else {
    local_748._0_8_ = local_748 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"input-file","");
    paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]
                               ((abstract_variables_map *)local_848,(string *)local_748);
    pbVar20 = boost::any_cast<std::__cxx11::string_const&>(paVar19);
    pcVar1 = (pbVar20->_M_dataplus)._M_p;
    local_ce8._0_8_ = (pointer)(local_ce8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_ce8,pcVar1,pcVar1 + pbVar20->_M_string_length);
    if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
      operator_delete((void *)local_748._0_8_);
    }
    std::ifstream::ifstream(local_748);
    std::ifstream::open((char *)local_748,(_Ios_Openmode)local_ce8._0_8_);
    if (*(int *)(local_730 + *(size_type *)(local_748._0_8_ + -0x18) + 8) != 0) {
      std::ifstream::~ifstream(local_748);
      if ((pointer)local_ce8._0_8_ != (pointer)(local_ce8 + 0x10)) {
        operator_delete((void *)local_ce8._0_8_);
      }
      goto LAB_0012d39f;
    }
    do {
      local_c80._M_p = (pointer)0x0;
      local_c78._M_dataplus._M_p._0_1_ = 0;
      local_c88 = (undefined1  [8])&local_c78;
      cVar5 = std::ios::widen((char)*(size_type *)(local_748._0_8_ + -0x18) +
                              (char)(istream *)local_748);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_748,(string *)local_c88,cVar5);
      std::__cxx11::string::_M_append((char *)&local_d08,(ulong)local_c88);
      std::__cxx11::string::append((char *)&local_d08);
      if (local_c88 != (undefined1  [8])&local_c78) {
        operator_delete((void *)local_c88);
      }
    } while ((local_730[*(size_type *)(local_748._0_8_ + -0x18) + 8] & 2) == 0);
    std::ifstream::close();
    std::ifstream::~ifstream(local_748);
    if ((pointer)local_ce8._0_8_ != (pointer)(local_ce8 + 0x10)) {
      operator_delete((void *)local_ce8._0_8_);
    }
    local_748._0_8_ = local_748 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"dot","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_838,(key_type *)local_748);
    if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
      operator_delete((void *)local_748._0_8_);
    }
    local_748._0_8_ = local_748 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"verbose","");
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_838,(key_type *)local_748);
    if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
      operator_delete((void *)local_748._0_8_);
    }
    if (cVar21._M_node != cVar15._M_node) {
      local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"verbose","");
      avy::AvyEnableLog(&local_b20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
        operator_delete(local_b20._M_dataplus._M_p);
      }
    }
    local_748._0_8_ = local_748 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"log","");
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(local_838,(key_type *)local_748);
    if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
      operator_delete((void *)local_748._0_8_);
    }
    if (cVar21._M_node != cVar15._M_node) {
      local_748._0_8_ = local_748 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"log","");
      paVar19 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((abstract_variables_map *)local_848,(string *)local_748);
      __x = boost::
            any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                      (paVar19);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_ce8,__x);
      if ((pointer)local_748._0_8_ != (pointer)(local_748 + 0x10)) {
        operator_delete((void *)local_748._0_8_);
      }
      if ((pointer)CONCAT71(local_ce8._9_7_,local_ce8[8]) != (pointer)local_ce8._0_8_) {
        uVar23 = 0;
        uVar24 = 1;
        do {
          lVar25 = *(long *)((long)&(((CFG *)(local_ce8._0_8_ + 0x18))->TrackedTerms).table_.
                                    super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                            + uVar23 * 0x20 + -0x18);
          local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b40,lVar25,
                     *(long *)((long)&(((CFG *)(local_ce8._0_8_ + 0x18))->TrackedTerms).table_.
                                      super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                              + uVar23 * 0x20 + -0x10) + lVar25);
          avy::AvyEnableLog(&local_b40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
            operator_delete(local_b40._M_dataplus._M_p);
          }
          bVar2 = uVar24 < (ulong)(CONCAT71(local_ce8._9_7_,local_ce8[8]) - local_ce8._0_8_ >> 5);
          uVar23 = uVar24;
          uVar24 = (ulong)((int)uVar24 + 1);
        } while (bVar2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_ce8);
    }
    iVar3 = local_d5c;
    local_d18 = local_d50;
    local_d1c = local_d54;
    local_d20 = local_d58;
    local_d0c = local_d60;
    local_d10 = local_d64;
    local_d14 = local_d68;
    local_ce8[0x10] = 0;
    auStack_cd7._0_8_ = 0;
    local_ce8._0_8_ = (pointer)0x0;
    local_ce8[8] = 0;
    local_ce8._9_7_ = 0;
    local_cc8 = 0x10;
    local_cc0 = 0;
    local_cb8 = 1.0;
    local_cb0 = 0;
    ppStack_ca8 = (bucket_pointer)0x0;
    local_ca0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_ca0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_ca0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c88 = (undefined1  [8])((ulong)local_c88 & 0xffffffff00000000);
    local_c80._M_p = (pointer)&local_c78._M_string_length;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c80,local_d08,local_d08 + local_d00);
    this = (TerminalFactory *)operator_new(0x18);
    covenant::TerminalFactory::TerminalFactory(this);
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr<covenant::TerminalFactory>
              (&local_c40,this);
    local_c30[0].px = local_c40.px;
    local_c30[0].pn.pi_ = local_c40.pn.pi_;
    if (local_c40.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_c40.pn.pi_)->use_count_ = (local_c40.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    covenant::parse_problem<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
              ((CFGProblem *)local_ce8,(StrParse *)local_c88,local_c30);
    boost::detail::shared_count::~shared_count(&local_c30[0].pn);
    iVar6 = (int)(CONCAT71(local_ce8._9_7_,local_ce8[8]) - local_ce8._0_8_ >> 3) * 0x286bca1b;
    if (iVar6 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"covenant: no CFGs found.",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
    }
    else {
      local_d24 = iVar3;
      if (0 < iVar6) {
        lVar27 = 0;
        lVar25 = 0;
        do {
          uVar4 = local_ce8._0_8_;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_748,
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&(((string *)
                              (&(((CFG *)(local_ce8._0_8_ + 0x18))->TrackedTerms).table_.
                                super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                              + -8))->_M_dataplus)._M_p + lVar27));
          covenant::CFG::CFG((CFG *)local_730,
                             (CFG *)((((CFG *)(uVar4 + 0x18))->TrackedTerms).table_.
                                     super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>
                                     .funcs_ + lVar27 + -1));
          if (local_748._0_8_ == local_748._8_8_) {
            psVar22 = (string *)__cxa_allocate_exception(0x20);
            local_b60 = local_b50;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b60,"expected at least one CFG","");
            *(string **)psVar22 = psVar22 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar22,local_b60,local_b60 + local_b58);
            __cxa_throw(psVar22,&covenant::error::typeinfo,covenant::error::~error);
          }
          covenant::CFG::check_well_formed((CFG *)local_730);
          covenant::CFG::~CFG((CFG *)local_730);
          if ((pointer)local_748._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_748._0_8_);
          }
          lVar25 = lVar25 + 1;
          lVar27 = lVar27 + 0x98;
        } while (lVar25 < (int)((ulong)(CONCAT71(local_ce8._9_7_,local_ce8[8]) - local_ce8._0_8_) >>
                               3) * 0x286bca1b);
      }
      s = (reg_solver_t *)operator_new(8);
      s->_vptr_RegSolver = (_func_int **)&PTR__RegSolver_001a8ee0;
      std::
      vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>::
      vector(&local_7a8.cns,
             (vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
              *)local_ce8);
      iVar3 = local_d24;
      boost::unordered::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::unordered_map(&local_7a8.var_table,
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)(auStack_cd7 + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_7a8.names,&local_ca0);
      local_c78.field_2._8_4_ = local_d18;
      local_c78.field_2._12_4_ = local_d1c;
      AStack_c58 = local_d20;
      uStack_c53 = local_d4b;
      uStack_c51 = local_d49;
      local_c50 = iVar3;
      iStack_c4c = local_d0c;
      uStack_c48 = local_d10;
      uStack_c44 = local_d14;
      opts_.gen = local_d1c;
      opts_.max_cegar_iter = local_d18;
      opts_.is_dot_enabled = cVar18._M_node != cVar15._M_node;
      opts_.abs = local_d20;
      opts_._13_2_ = local_d4b;
      opts_._15_1_ = local_d49;
      opts_.freq_incr_witness = local_d0c;
      opts_.shortest_witness = iVar3;
      opts_.num_solutions = local_d14;
      opts_.incr_witness = local_d10;
      uStack_c54 = cVar18._M_node != cVar15._M_node;
      covenant::Solver<covenant::Sym>::Solver((Solver<covenant::Sym> *)local_748,&local_7a8,s,opts_)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_7a8.names);
      boost::unordered::detail::
      table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~table(&local_7a8.var_table.table_);
      std::
      vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>::
      ~vector(&local_7a8.cns);
      covenant::Solver<covenant::Sym>::preprocess((Solver<covenant::Sym> *)local_748);
      local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"stats","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(local_838,&local_b80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
        operator_delete(local_b80._M_dataplus._M_p);
      }
      if (cVar18._M_node == cVar15._M_node) {
        SVar7 = covenant::Solver<covenant::Sym>::solve((Solver<covenant::Sym> *)local_748);
        if (SVar7 == SAT) {
          lVar25 = 0x12;
          pcVar26 = "======\nSAT\n======\n";
        }
        else if (SVar7 == UNSAT) {
          lVar25 = 0x14;
          pcVar26 = "======\nUNSAT\n======\n";
        }
        else {
          lVar25 = 0x16;
          pcVar26 = "======\nUNKNOWN\n======\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar26,lVar25);
        covenant::Solver<covenant::Sym>::~Solver((Solver<covenant::Sym> *)local_748);
        (*s->_vptr_RegSolver[1])(s);
      }
      else {
        covenant::Solver<covenant::Sym>::stats
                  ((Solver<covenant::Sym> *)local_748,(ostream *)&std::cout);
        (*s->_vptr_RegSolver[1])(s);
        covenant::Solver<covenant::Sym>::~Solver((Solver<covenant::Sym> *)local_748);
      }
    }
    boost::detail::shared_count::~shared_count(&local_c40.pn);
    if ((size_type *)local_c80._M_p != &local_c78._M_string_length) {
      operator_delete(local_c80._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ca0);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~table((table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(auStack_cd7 + 7));
    std::vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
    ::~vector((vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
               *)local_ce8);
  }
  if (local_d08 != local_cf8) {
    operator_delete(local_d08);
  }
LAB_0012dc25:
  local_848[0] = &PTR__variables_map_001a7898;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_7d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_808);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_838);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_a98);
  if (local_ac0 != (void *)0x0) {
    operator_delete(local_ac0);
    local_ac0 = (void *)0x0;
    local_ab8 = 0;
    local_ab0 = 0;
    local_aa8 = 0;
    local_aa0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
             *)(local_b00 + 0x28));
  if ((undefined1 *)CONCAT44(local_b00._4_4_,local_b00._0_4_) != local_b00 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_b00._4_4_,local_b00._0_4_));
  }
  if (local_9e8 != local_9d8) {
    operator_delete(local_9e8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a00);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_a18);
  if (local_a40 != (void *)0x0) {
    operator_delete(local_a40);
    local_a40 = (void *)0x0;
    local_a38 = 0;
    local_a30 = 0;
    local_a28 = 0;
    local_a20 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_a58);
  if ((undefined1 *)CONCAT44(uStack_a7c,local_a80) != local_a70) {
    operator_delete((undefined1 *)CONCAT44(uStack_a7c,local_a80));
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_960);
  if (local_988 != (void *)0x0) {
    operator_delete(local_988);
    local_988 = (void *)0x0;
    local_980 = 0;
    local_978 = 0;
    local_970 = 0;
    local_968 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_9a0);
  if ((undefined1 *)CONCAT44(uStack_9c4,local_9c8) != local_9b8) {
    operator_delete((undefined1 *)CONCAT44(uStack_9c4,local_9c8));
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_8e0);
  if (local_908 != (void *)0x0) {
    operator_delete(local_908);
    local_908 = (void *)0x0;
    local_900 = 0;
    local_8f8 = 0;
    local_8f0 = 0;
    local_8e8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_920);
  if ((undefined1 *)CONCAT44(uStack_944,local_948) != local_938) {
    operator_delete((undefined1 *)CONCAT44(uStack_944,local_948));
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_860);
  if (local_888 != (void *)0x0) {
    operator_delete(local_888);
    local_888 = (void *)0x0;
    local_880 = 0;
    local_878 = 0;
    local_870 = 0;
    local_868 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_8a0);
  if (local_8c8[0] != local_8b8) {
    operator_delete(local_8c8[0]);
  }
  if (local_d48 != local_d38) {
    operator_delete(local_d48);
  }
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
  typedef Sym edge_sym_t;
  typedef Solver<edge_sym_t> solver_t;
  typedef RegSolver<edge_sym_t> reg_solver_t;

  // Main flags
  int max_cegar_iter=-1;
  GeneralizationMethod gen = GREEDY;
  AbstractMethod abs = CYCLE_BREAKING;
  // Heuristics flags
  // - regular solver will try to find a witness starting from this length
  int shortest_witness = 0;
  // - increase the witness length after n iterations -1 disable this option.
  int freq_incr_witness = -1;
  // - increment the witness length by n but only if freq_incr_witness >= 0
  unsigned incr_witness = 1;
  // Other flags
  bool is_dot_enabled=false;
  unsigned num_solutions = 1;

  string header("Covenant: semi-decider for intersection of context-free languages\n");
  header += string ("Authors : G.Gange, J.A.Navas, P.Schachte, H.Sondergaard, and P.J.Stuckey\n");
  header += string ("Usage   : covenant [Options] file");

  po::options_description config("General options ");
  config.add_options()
      ("help,h", "print help message")
      ("dot" , 
       "print solutions and emptiness proofs in dot format as well as the result of abstractions and refinements")
      ("verbose,v" , "verbose mode")
      ("stats,s", "Show some statistics and exit")
      ("solutions" , po::value<unsigned>(&num_solutions)->default_value(1), 
       "enumerate up to n solutions (default n=1)")
      ("iter,i",  po::value<int>(&max_cegar_iter)->default_value(-1), 
       "maximum number of CEGAR iterations (default no limit)")
      ("abs,a",  po::value<AbstractMethod>(&abs)->default_value(CYCLE_BREAKING), 
       "choose abstraction method [sigma-star|cycle-breaking]")
      ("gen,g",  po::value<GeneralizationMethod>(&gen)->default_value(GREEDY), 
       "choose generalization method [greedy|max-gen]")
      ;

  po::options_description hidden_params("");
  hidden_params.add_options()
      ("input-file",  po::value<string>(), "input file")
      ;
      
  po::options_description cegar_params("(unsound) cegar options ");
  cegar_params.add_options()
      ("l",  po::value<int>(&shortest_witness)->default_value(0), 
       "shortest length of the witness (default 0)")
      ("freq-incr-witness",  po::value<int>(&freq_incr_witness)->default_value(-1), 
       "how often increasing witnesses' length")
      ("delta-incr-witness",  po::value<unsigned>(&incr_witness)->default_value(1), 
       "how much witnesses' length is incremented")
      ;

  po::options_description log("Logging Options");
  log.add_options()
      ("log",  po::value<std::vector<string> >(), "Enable specified log level")
      ;

  po::positional_options_description p;
  p.add("input-file", -1);

  po::options_description cmmdline_options;
  cmmdline_options.add(config);
  cmmdline_options.add(hidden_params);
  cmmdline_options.add(cegar_params);
  cmmdline_options.add(log);
  
  po::variables_map vm;

  try {
    po::store(po::command_line_parser(argc, argv).
              options(cmmdline_options).
              positional(p).
              run(), vm);
    po::notify(vm);    
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (vm.count("help"))
  {
    cout << header << endl << config << endl; 
    return 0;
  }  

  std::string in;
  bool file_opened = false;
  if (vm.count ("input-file"))
  {
    std::string infile = vm ["input-file"].as<std::string> ();
    std::ifstream fd;
    fd.open (infile.c_str ());
    if (fd.good ())
    {
      file_opened = true;
      while (!fd.eof ())
      {
        std::string line;
        getline(fd, line);
        in += line;
        in += "\n";
      }
      fd.close ();
    }
  }

  if (!file_opened)
  {
    cout << "Input file not found " << endl;
    return 0;
  }

  if (vm.count("dot"))
  {
    is_dot_enabled = true;
  }

  if (vm.count("verbose"))
  {
    avy::AvyEnableLog ("verbose");
  }

  // enable loggers
  if (vm.count("log"))
  {
    vector<string> loggers = vm ["log"].as<vector<string> > ();
    for(unsigned int i=0; i<loggers.size (); i++)
    {
      avy::AvyEnableLog (loggers [i]);
    }
  }

  solver_t::Options opts(max_cegar_iter, 
                         gen, 
                         abs, 
                         is_dot_enabled, 
                         shortest_witness, 
                         freq_incr_witness, 
                         incr_witness,
                         num_solutions);

  CFGProblem problem;
  StrParse input(in); 
  boost::shared_ptr<TerminalFactory> tfac (new TerminalFactory ());
  try
  {
    parse_problem(problem, input, tfac);
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }

  if (problem.size() == 0)
  {
    cerr << "covenant: no CFGs found." << endl;  
    return 0;
  }

  try
  {
    for(int ii = 0; ii < problem.size(); ii++)
    {
      CFGProblem::Constraint cn(problem[ii]);
      if (cn.vars.empty())
      {
        throw error("expected at least one CFG");
      }
      cn.lang.check_well_formed();
    }
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
    return 0;
  }
    
  reg_solver_t *regsolver = new Product<edge_sym_t>();
  try
  {
    solver_t s(problem, regsolver, opts);

    s.preprocess ();

    if (vm.count("stats"))
    {
      s.stats (cout);
      delete regsolver;
      return 0;
    }

    STATUS res = s.solve();

    switch (res)
    {
      case SAT:
        cout << "======\nSAT\n======\n";
        break;
      case UNSAT:
        cout << "======\nUNSAT\n======\n";
        break;
      default:
        cout << "======\nUNKNOWN\n======\n";  
        break;
    }
      
  }
  catch(error &e)
  {
    cerr << "covenant error:" << e << endl;
  }
  catch(Exit &e)
  {
    cerr << e << endl;
  }

  delete regsolver;

  return 0;
}